

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O0

QIcon __thiscall QFileIconProvider::icon(QFileIconProvider *this,QFileInfo *info)

{
  bool bVar1;
  byte bVar2;
  QFileIconProviderPrivate *this_00;
  ulong uVar3;
  QFileIconProviderPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *path;
  QFileIconProviderPrivate *d;
  QIcon retIcon;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QFileIconProviderPrivate *this_01;
  StandardPixmap in_stack_ffffffffffffff9c;
  undefined1 local_28 [24];
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QFileIconProvider *)0x2c75f2);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileIconProviderPrivate::getIcon(this_01,(QFileInfo *)in_RDI);
  uVar3 = QIcon::isNull();
  if ((uVar3 & 1) == 0) {
    QIcon::QIcon((QIcon *)in_RDI,
                 (QIcon *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    goto LAB_002c77e0;
  }
  QFileInfo::absoluteFilePath();
  bVar1 = QString::isEmpty((QString *)0x2c7673);
  if (bVar1) {
LAB_002c7687:
    QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
  }
  else {
    uVar3 = QFileSystemEntry::isRootPath((QString *)local_28);
    if ((uVar3 & 1) != 0) goto LAB_002c7687;
    uVar3 = QFileInfo::isFile();
    if ((uVar3 & 1) == 0) {
      uVar3 = QFileInfo::isDir();
      if ((uVar3 & 1) == 0) {
        QIcon::QIcon((QIcon *)in_RDI);
      }
      else {
        uVar3 = QFileInfo::isSymLink();
        if ((uVar3 & 1) == 0) {
          QFileInfo::absoluteFilePath();
          bVar2 = ::operator==((QString *)in_RDI,
                               (QString *)
                               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          QString::~QString((QString *)0x2c777e);
          if ((bVar2 & 1) == 0) {
            QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
          }
          else {
            QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
          }
        }
        else {
          QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
        }
      }
    }
    else {
      uVar3 = QFileInfo::isSymLink();
      if ((uVar3 & 1) == 0) {
        QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
      }
      else {
        QFileIconProviderPrivate::getIcon(this_00,in_stack_ffffffffffffff9c);
      }
    }
  }
  QString::~QString((QString *)0x2c77e0);
LAB_002c77e0:
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)(QIconPrivate *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFileIconProvider::icon(const QFileInfo &info) const
{
    Q_D(const QFileIconProvider);

    QIcon retIcon = d->getIcon(info);
    if (!retIcon.isNull())
        return retIcon;

    const QString &path = info.absoluteFilePath();
    if (path.isEmpty() || QFileSystemEntry::isRootPath(path))
#if defined (Q_OS_WIN)
    {
        UINT type = GetDriveType(reinterpret_cast<const wchar_t *>(path.utf16()));

        switch (type) {
        case DRIVE_REMOVABLE:
            return d->getIcon(QStyle::SP_DriveFDIcon);
        case DRIVE_FIXED:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        case DRIVE_REMOTE:
            return d->getIcon(QStyle::SP_DriveNetIcon);
        case DRIVE_CDROM:
            return d->getIcon(QStyle::SP_DriveCDIcon);
        case DRIVE_RAMDISK:
        case DRIVE_UNKNOWN:
        case DRIVE_NO_ROOT_DIR:
        default:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        }
    }
#else
    return d->getIcon(QStyle::SP_DriveHDIcon);
#endif

    if (info.isFile()) {
        if (info.isSymLink())
            return d->getIcon(QStyle::SP_FileLinkIcon);
        else
            return d->getIcon(QStyle::SP_FileIcon);
    }
  if (info.isDir()) {
    if (info.isSymLink()) {
      return d->getIcon(QStyle::SP_DirLinkIcon);
    } else {
      if (info.absoluteFilePath() == d->homePath) {
        return d->getIcon(QStyle::SP_DirHomeIcon);
      } else {
        return d->getIcon(QStyle::SP_DirIcon);
      }
    }
  }
  return QIcon();
}